

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnThrow(SharedValidator *this,Location *loc,Var *tag_var)

{
  Result rhs;
  Var local_98;
  Enum local_4c;
  undefined1 local_48 [8];
  TagType tag_type;
  Var *tag_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)
                 ((long)&tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),Throw);
  this_local._4_4_ =
       CheckInstr(this,tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,loc);
  TagType::TagType((TagType *)local_48);
  Var::Var(&local_98,tag_var);
  local_4c = (Enum)CheckTagIndex(this,&local_98,(TagType *)local_48);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_4c);
  Var::~Var(&local_98);
  rhs = TypeChecker::OnThrow(&this->typechecker_,(TypeVector *)local_48);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  TagType::~TagType((TagType *)local_48);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnThrow(const Location& loc, Var tag_var) {
  Result result = CheckInstr(Opcode::Throw, loc);
  TagType tag_type;
  result |= CheckTagIndex(tag_var, &tag_type);
  result |= typechecker_.OnThrow(tag_type.params);
  return result;
}